

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O2

void __thiscall trento::Event::Event(Event *this,VarMap *var_map)

{
  _Rb_tree_header *p_Var1;
  any *paVar2;
  double *pdVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Any_data __tmp;
  allocator<double> local_79;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  undefined1 local_58 [16];
  pair<long,_long> local_48;
  
  local_58._8_8_ = local_58._0_8_;
  *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) = 0
  ;
  (this->compute_reduced_thickness_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->compute_reduced_thickness_)._M_invoker = (_Invoker_type)0x0;
  std::__cxx11::string::string
            ((string *)local_78._M_pod_data,"normalization",(allocator *)&local_48);
  paVar2 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar3 = boost::any_cast<double_const&>(paVar2);
  local_58._0_8_ = *pdVar3;
  std::__cxx11::string::~string((string *)local_78._M_pod_data);
  this->norm_ = (double)local_58._0_8_;
  std::__cxx11::string::string((string *)local_78._M_pod_data,"grid-step",(allocator *)&local_48);
  paVar2 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar3 = boost::any_cast<double_const&>(paVar2);
  local_58._0_8_ = *pdVar3;
  std::__cxx11::string::~string((string *)local_78._M_pod_data);
  this->dxy_ = (double)local_58._0_8_;
  std::__cxx11::string::string((string *)local_78._M_pod_data,"grid-max",(allocator *)&local_48);
  paVar2 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar3 = boost::any_cast<double_const&>(paVar2);
  auVar7._0_8_ = (*pdVar3 + *pdVar3) / this->dxy_;
  auVar7._8_8_ = 0;
  local_58 = vroundsd_avx(auVar7,auVar7,10);
  dVar6 = local_58._0_8_;
  std::__cxx11::string::~string((string *)local_78._M_pod_data);
  auVar8._0_4_ = (int)(double)local_58._0_8_;
  auVar8._4_4_ = (int)(double)local_58._8_8_;
  auVar8._8_8_ = 0;
  this->nsteps_ = (int)dVar6;
  auVar5 = vcvtdq2pd_avx(auVar8);
  this->xymax_ = auVar5._0_8_ * 0.5 * this->dxy_;
  local_48 = (pair<long,_long>)
             boost::detail::multi_array::extent_gen<0UL>::operator[]
                       ((extent_gen<0UL> *)boost::(anonymous_namespace)::extents,(long)(int)dVar6);
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<2UL> *)&local_78,(extent_gen<1UL> *)&local_48,(long)this->nsteps_);
  boost::multi_array<double,_2UL,_std::allocator<double>_>::multi_array
            (&this->TA_,(extent_gen<2UL> *)&local_78,&local_79);
  local_48 = (pair<long,_long>)
             boost::detail::multi_array::extent_gen<0UL>::operator[]
                       ((extent_gen<0UL> *)boost::(anonymous_namespace)::extents,(long)this->nsteps_
                       );
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<2UL> *)&local_78,(extent_gen<1UL> *)&local_48,(long)this->nsteps_);
  boost::multi_array<double,_2UL,_std::allocator<double>_>::multi_array
            (&this->TB_,(extent_gen<2UL> *)&local_78,&local_79);
  local_48 = (pair<long,_long>)
             boost::detail::multi_array::extent_gen<0UL>::operator[]
                       ((extent_gen<0UL> *)boost::(anonymous_namespace)::extents,(long)this->nsteps_
                       );
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<2UL> *)&local_78,(extent_gen<1UL> *)&local_48,(long)this->nsteps_);
  boost::multi_array<double,_2UL,_std::allocator<double>_>::multi_array
            (&this->TR_,(extent_gen<2UL> *)&local_78,&local_79);
  p_Var1 = &(this->eccentricity_)._M_t._M_impl.super__Rb_tree_header;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string
            ((string *)local_78._M_pod_data,"reduced-thickness",(allocator *)&local_48);
  paVar2 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar3 = boost::any_cast<double_const&>(paVar2);
  local_58._8_8_ = 0;
  local_58._0_8_ = *pdVar3;
  std::__cxx11::string::~string((string *)local_78._M_pod_data);
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar5 = vandpd_avx512vl(local_58,auVar5);
  if (1e-12 <= auVar5._0_8_) {
    dVar6 = local_58._0_8_;
    if (dVar6 <= 0.0) {
      local_78._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor;
      local_78._8_8_ =
           *(undefined8 *)
            ((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8);
      *(Event **)&(this->compute_reduced_thickness_).super__Function_base._M_functor = this;
      *(double *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) =
           dVar6;
      local_68 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
      p_Stack_60 = (this->compute_reduced_thickness_)._M_invoker;
      (this->compute_reduced_thickness_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:71:34)>
           ::_M_manager;
      pcVar4 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:71:34)>
               ::_M_invoke;
    }
    else {
      local_78._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor;
      local_78._8_8_ =
           *(undefined8 *)
            ((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8);
      *(Event **)&(this->compute_reduced_thickness_).super__Function_base._M_functor = this;
      *(double *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) =
           dVar6;
      local_68 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
      p_Stack_60 = (this->compute_reduced_thickness_)._M_invoker;
      (this->compute_reduced_thickness_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:66:34)>
           ::_M_manager;
      pcVar4 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:66:34)>
               ::_M_invoke;
    }
  }
  else {
    local_48.second = 0;
    local_48.first = (long)this;
    local_78._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor;
    local_78._8_8_ =
         *(undefined8 *)
          ((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8);
    *(Event **)&(this->compute_reduced_thickness_).super__Function_base._M_functor = this;
    *(undefined8 *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) =
         0;
    local_68 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
    p_Stack_60 = (this->compute_reduced_thickness_)._M_invoker;
    (this->compute_reduced_thickness_).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:62:34)>
         ::_M_manager;
    pcVar4 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:62:34)>
             ::_M_invoke;
  }
  (this->compute_reduced_thickness_)._M_invoker = pcVar4;
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  return;
}

Assistant:

Event::Event(const VarMap& var_map)
    : norm_(var_map["normalization"].as<double>()),
      dxy_(var_map["grid-step"].as<double>()),
      nsteps_(std::ceil(2.*var_map["grid-max"].as<double>()/dxy_)),
      xymax_(.5*nsteps_*dxy_),
      TA_(boost::extents[nsteps_][nsteps_]),
      TB_(boost::extents[nsteps_][nsteps_]),
      TR_(boost::extents[nsteps_][nsteps_]) {
  // Choose which version of the generalized mean to use based on the
  // configuration.  The possibilities are defined above.  See the header for
  // more information.
  auto p = var_map["reduced-thickness"].as<double>();

  if (std::fabs(p) < TINY) {
    compute_reduced_thickness_ = [this]() {
      compute_reduced_thickness(geometric_mean);
    };
  } else if (p > 0.) {
    compute_reduced_thickness_ = [this, p]() {
      compute_reduced_thickness(
        [p](double a, double b) { return positive_pmean(p, a, b); });
    };
  } else {
    compute_reduced_thickness_ = [this, p]() {
      compute_reduced_thickness(
        [p](double a, double b) { return negative_pmean(p, a, b); });
    };
  }
}